

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

ByteArray *
ot::commissioner::internal::ExtractRouterIds(ByteArray *__return_storage_ptr__,ByteArray *aMask)

{
  undefined8 in_RAX;
  size_t i;
  ulong uVar1;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uStack_28 = in_RAX;
  for (uVar1 = 0; uVar1 != 0x40; uVar1 = uVar1 + 1) {
    if ((char)((aMask->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar1 >> 3] << ((byte)uVar1 & 7)) < '\0') {
      uStack_28 = CONCAT17((byte)uVar1,(undefined7)uStack_28);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (__return_storage_ptr__,(uchar *)((long)&uStack_28 + 7));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ByteArray internal::ExtractRouterIds(const ByteArray &aMask)
{
    ByteArray routerIdList;

    for (size_t i = 0; i < kRouterIdMaskBytes * 8; i++)
    {
        if ((aMask[i / 8] & (0x80 >> (i % 8))) != 0)
        {
            routerIdList.push_back(i);
        }
    }

    return routerIdList;
}